

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_common.cpp
# Opt level: O0

void __thiscall
cfd::SignParameter::SignParameter
          (SignParameter *this,string *text_message,bool der_encode,SigHashType *sighash_type)

{
  undefined1 uVar1;
  value_type vVar2;
  ScriptType SVar3;
  reference pvVar4;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  byte in_DL;
  string *in_RSI;
  ByteData *in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> list;
  ByteData *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  undefined1 *__n;
  undefined7 in_stack_ffffffffffffff20;
  ByteData local_b0;
  ByteData local_98;
  undefined1 local_79;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78 [24];
  ScriptOperator local_60;
  byte local_11;
  string *local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  core::ByteData::ByteData(in_RDI);
  *(undefined4 *)
   &in_RDI[1].data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = 1;
  core::Pubkey::Pubkey
            ((Pubkey *)
             &in_RDI[1].data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  *(undefined1 *)
   &in_RDI[2].data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = 0;
  core::SigHashType::SigHashType
            ((SigHashType *)
             ((long)&in_RDI[2].data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish + 4));
  core::ScriptOperator::ScriptOperator
            ((ScriptOperator *)(in_RDI + 3),(ScriptOperator *)core::ScriptOperator::OP_INVALIDOPCODE
            );
  uVar1 = core::ScriptOperator::IsValid(local_10);
  if ((bool)uVar1) {
    *(undefined4 *)
     &in_RDI[1].data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = 4;
    core::ScriptOperator::Get(&local_60,local_10);
    core::ScriptOperator::operator=((ScriptOperator *)(in_RDI + 3),&local_60);
    core::ScriptOperator::~ScriptOperator((ScriptOperator *)0x50a4dd);
    __n = &local_79;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x50a4ef);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(uVar1,in_stack_ffffffffffffff20),(size_type)__n,
               (allocator_type *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x50a515);
    SVar3 = core::ScriptOperator::GetDataType((ScriptOperator *)(in_RDI + 3));
    vVar2 = (value_type)SVar3;
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_78,0);
    *pvVar4 = vVar2;
    core::ByteData::ByteData
              (&local_98,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78);
    core::ByteData::operator=
              ((ByteData *)CONCAT17(vVar2,in_stack_ffffffffffffff00),in_stack_fffffffffffffef8);
    core::ByteData::~ByteData((ByteData *)0x50a577);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(SVar3,in_stack_ffffffffffffff10));
  }
  else {
    core::ByteData::ByteData(&local_b0,local_10);
    core::ByteData::operator=
              ((ByteData *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),&local_b0);
    core::ByteData::~ByteData((ByteData *)0x50a673);
    *(byte *)&in_RDI[2].data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish = local_11 & 1;
    core::SigHashType::operator=
              ((SigHashType *)
               ((long)&in_RDI[2].data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish + 4),
               (SigHashType *)CONCAT71(in_register_00000009,in_CL));
    if ((local_11 & 1) != 0) {
      *(undefined4 *)
       &in_RDI[1].data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = 0;
    }
  }
  return;
}

Assistant:

SignParameter::SignParameter(
    const std::string& text_message, bool der_encode,
    const SigHashType sighash_type)
    : data_(),
      data_type_(SignDataType::kBinary),
      related_pubkey_(),
      der_encode_(false),
      sighash_type_(),
      op_code_(ScriptOperator::OP_INVALIDOPCODE) {
  if (ScriptOperator::IsValid(text_message)) {
    data_type_ = SignDataType::kOpCode;
    op_code_ = ScriptOperator::Get(text_message);
    std::vector<uint8_t> list(1);
    list[0] = static_cast<uint8_t>(op_code_.GetDataType());
    data_ = ByteData(list);
  } else {
    data_ = ByteData(text_message);
    der_encode_ = der_encode;
    sighash_type_ = sighash_type;
    if (der_encode) data_type_ = SignDataType::kSign;
  }
}